

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O3

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenDecNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  
  iVar1 = in_RSI->currentChar;
  while (iVar1 - 0x30U < 10) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
  }
  if (iVar1 == 0x2e) {
    nextTokenFltNum(this,(size_t)in_RSI);
  }
  else {
    nextTokenNumType(this,(uint64_t)in_RSI);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenDecNum() noexcept {
  size_t num = 0;
  while (std::isdigit(currentChar)) {
    num *= 10;
    num += currentChar - '0';
    nextChar(); // eat decimal digit
  }

  if (currentChar == '.')
    return nextTokenFltNum(num);

  return nextTokenNumType(num);
}